

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3acc_io.c
# Opt level: O1

int rdacc_mixw(char *dir,float32 ****inout_mixw_acc,uint32 *inout_n_mixw,uint32 *inout_n_stream,
              uint32 *inout_n_density)

{
  int iVar1;
  char *fmt;
  long ln;
  int iVar2;
  ulong uVar3;
  uint32 n_density;
  uint32 n_stream;
  uint32 n_mixw;
  float32 ***in_mixw_acc;
  char fn [4097];
  uint32 uVar4;
  uint local_104c;
  uint local_1048;
  uint local_1044;
  float32 ***local_1040;
  char local_1038 [4112];
  
  sprintf(local_1038,"%s/mixw_counts",dir);
  iVar1 = s3mixw_read(local_1038,&local_1040,&local_1044,&local_1048,&local_104c);
  iVar2 = -1;
  if (iVar1 != 0) {
    return -1;
  }
  if (*inout_mixw_acc == (float32 ***)0x0) {
    *inout_mixw_acc = local_1040;
    *inout_n_mixw = local_1044;
    *inout_n_stream = local_1048;
    *inout_n_density = local_104c;
LAB_00107208:
    iVar2 = 0;
  }
  else {
    uVar4 = *inout_n_mixw;
    uVar3 = (ulong)local_1044;
    if (uVar4 == local_1044) {
      uVar4 = *inout_n_stream;
      if (uVar4 == local_1048) {
        uVar4 = *inout_n_density;
        if (uVar4 == local_104c) {
          accum_3d(*inout_mixw_acc,local_1040,local_1044,local_1048,local_104c);
          ckd_free_3d(local_1040);
          goto LAB_00107208;
        }
        fmt = "# density comp/mix in file %s (== %u) != prior # density (== %u)\n";
        ln = 0xa4;
        uVar3 = (ulong)local_104c;
      }
      else {
        fmt = "# stream in file %s (== %u) != prior # stream (== %u)\n";
        ln = 0x9d;
        uVar3 = (ulong)local_1048;
      }
    }
    else {
      fmt = "# mixw in file %s (== %u) != prior # mixw (== %u)\n";
      ln = 0x96;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
            ,ln,fmt,local_1038,uVar3,uVar4);
  }
  return iVar2;
}

Assistant:

int
rdacc_mixw(const char *dir,
           float32 **** inout_mixw_acc,
           uint32 * inout_n_mixw,
           uint32 * inout_n_stream, uint32 * inout_n_density)
{
    char fn[MAXPATHLEN + 1];
    float32 ***in_mixw_acc;
    float32 ***mixw_acc;
    uint32 n_mixw;
    uint32 n_stream;
    uint32 n_density;

    sprintf(fn, "%s/mixw_counts", dir);

    if (s3mixw_read(fn,
                    &in_mixw_acc,
                    &n_mixw, &n_stream, &n_density) != S3_SUCCESS) {
        return S3_ERROR;
    }

    mixw_acc = *inout_mixw_acc;

    if (mixw_acc == NULL) {
        *inout_mixw_acc = mixw_acc = in_mixw_acc;
        *inout_n_mixw = n_mixw;
        *inout_n_stream = n_stream;
        *inout_n_density = n_density;
    }
    else {
        if (*inout_n_mixw != n_mixw) {
            E_ERROR
                ("# mixw in file %s (== %u) != prior # mixw (== %u)\n",
                 fn, n_mixw, *inout_n_mixw);
            return S3_ERROR;
        }

        if (*inout_n_stream != n_stream) {
            E_ERROR
                ("# stream in file %s (== %u) != prior # stream (== %u)\n",
                 fn, n_stream, *inout_n_stream);
            return S3_ERROR;
        }

        if (*inout_n_density != n_density) {
            E_ERROR
                ("# density comp/mix in file %s (== %u) != prior # density (== %u)\n",
                 fn, n_density, *inout_n_density);
            return S3_ERROR;
        }

        accum_3d(mixw_acc, in_mixw_acc, n_mixw, n_stream, n_density);

        ckd_free_3d((void ***) in_mixw_acc);
    }

    return S3_SUCCESS;
}